

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raft_server.cxx
# Opt level: O0

int32 __thiscall nuraft::raft_server::get_quorum_for_election(raft_server *this)

{
  int32 iVar1;
  element_type *peVar2;
  raft_server *in_stack_00000010;
  int32 num_voting_members;
  ptr<raft_params> params;
  undefined4 in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffdc;
  int local_4;
  
  std::unique_ptr<nuraft::context,_std::default_delete<nuraft::context>_>::operator->
            ((unique_ptr<nuraft::context,_std::default_delete<nuraft::context>_> *)0x32bd8e);
  nuraft::context::get_params
            ((context *)CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8));
  iVar1 = get_num_voting_members(in_stack_00000010);
  peVar2 = std::__shared_ptr_access<nuraft::raft_params,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<nuraft::raft_params,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x32bdbc);
  if (0 < peVar2->custom_election_quorum_size_) {
    peVar2 = std::__shared_ptr_access<nuraft::raft_params,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<nuraft::raft_params,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x32bdcc);
    if (peVar2->custom_election_quorum_size_ <= iVar1) {
      peVar2 = std::
               __shared_ptr_access<nuraft::raft_params,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<nuraft::raft_params,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x32be13);
      local_4 = peVar2->custom_election_quorum_size_ + -1;
      goto LAB_0032be25;
    }
  }
  local_4 = iVar1 / 2;
LAB_0032be25:
  std::shared_ptr<nuraft::raft_params>::~shared_ptr((shared_ptr<nuraft::raft_params> *)0x32be2f);
  return local_4;
}

Assistant:

int32 raft_server::get_quorum_for_election() {
    ptr<raft_params> params = ctx_->get_params();
    int32 num_voting_members = get_num_voting_members();
    if ( params->custom_election_quorum_size_ <= 0 ||
         params->custom_election_quorum_size_ > num_voting_members ) {
        return num_voting_members / 2;
    }
    return params->custom_election_quorum_size_ - 1;
}